

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable.hpp
# Opt level: O3

bool __thiscall
boost::condition_variable::do_wait_until
          (condition_variable *this,unique_lock<boost::mutex> *m,timespec *timeout)

{
  int ev;
  interruption_checker check_for_interruption;
  condition_error local_70;
  
  detail::interruption_checker::interruption_checker
            ((interruption_checker *)&local_70,&this->internal_mutex,&this->cond);
  unique_lock<boost::mutex>::unlock(m);
  ev = pthread_cond_timedwait
                 ((pthread_cond_t *)&this->cond,(pthread_mutex_t *)this,(timespec *)timeout);
  detail::interruption_checker::unlock_if_locked((interruption_checker *)&local_70);
  unique_lock<boost::mutex>::lock(m);
  detail::interruption_checker::unlock_if_locked((interruption_checker *)&local_70);
  this_thread::interruption_point();
  if ((ev != 0) && (ev != 0x6e)) {
    condition_error::condition_error
              (&local_70,ev,
               "boost::condition_variable::do_wait_until failed in pthread_cond_timedwait");
    throw_exception<boost::condition_error>(&local_70);
  }
  return ev != 0x6e;
}

Assistant:

inline bool condition_variable::do_wait_until(
                unique_lock<mutex>& m,
                struct timespec const &timeout)
    {
#if defined BOOST_THREAD_THROW_IF_PRECONDITION_NOT_SATISFIED
        if (!m.owns_lock())
        {
            boost::throw_exception(condition_error(EPERM, "boost::condition_variable::do_wait_until() failed precondition mutex not owned"));
        }
#endif
        int cond_res;
        {
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
            thread_cv_detail::lock_on_exit<unique_lock<mutex> > guard;
            detail::interruption_checker check_for_interruption(&internal_mutex,&cond);
            pthread_mutex_t* the_mutex = &internal_mutex;
            guard.activate(m);
            cond_res=pthread_cond_timedwait(&cond,the_mutex,&timeout);
            check_for_interruption.unlock_if_locked();
            guard.deactivate();
#else
            pthread_mutex_t* the_mutex = m.mutex()->native_handle();
            cond_res=pthread_cond_timedwait(&cond,the_mutex,&timeout);
#endif
        }
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
        this_thread::interruption_point();
#endif
        if(cond_res==ETIMEDOUT)
        {
            return false;
        }
        if(cond_res)
        {
            boost::throw_exception(condition_error(cond_res, "boost::condition_variable::do_wait_until failed in pthread_cond_timedwait"));
        }
        return true;
    }